

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase::sectionStarting
          (CumulativeReporterBase *this,SectionInfo *sectionInfo)

{
  pointer pPVar1;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  other;
  SectionNode *pSVar2;
  SectionNode *this_00;
  Ptr<Catch::CumulativeReporterBase::SectionNode> node;
  SectionStats incompleteStats;
  Counts local_d8;
  BySectionInfo local_c0;
  SectionStats local_b8;
  
  local_d8.passed = 0;
  local_d8.failed = 0;
  local_d8.failedButOk = 0;
  SectionStats::SectionStats(&local_b8,sectionInfo,&local_d8,0.0,false);
  local_d8.passed = 0;
  pPVar1 = (this->m_sectionStack).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_sectionStack).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start == pPVar1) {
    if ((this->m_rootSection).m_p == (SectionNode *)0x0) {
      pSVar2 = (SectionNode *)operator_new(0x120);
      SectionNode::SectionNode(pSVar2,&local_b8);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&this->m_rootSection,pSVar2);
    }
    Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
              ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_d8,&this->m_rootSection);
  }
  else {
    pSVar2 = pPVar1[-1].m_p;
    local_c0.m_other = sectionInfo;
    other = std::
            find_if<__gnu_cxx::__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>,Catch::CumulativeReporterBase::BySectionInfo>
                      ((pSVar2->childSections).
                       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pSVar2->childSections).
                       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_c0);
    if (other._M_current ==
        (pSVar2->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (SectionNode *)operator_new(0x120);
      SectionNode::SectionNode(this_00,&local_b8);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
                ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_d8,this_00);
      std::
      vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ::push_back(&pSVar2->childSections,(value_type *)&local_d8);
    }
    else {
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
                ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_d8,other._M_current);
    }
  }
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back(&this->m_sectionStack,(value_type *)&local_d8);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
            (&this->m_deepestSection,(Ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_d8);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::~Ptr
            ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_d8);
  SectionStats::~SectionStats(&local_b8);
  return;
}

Assistant:

virtual void sectionStarting( SectionInfo const& sectionInfo ) CATCH_OVERRIDE {
            SectionStats incompleteStats( sectionInfo, Counts(), 0, false );
            Ptr<SectionNode> node;
            if( m_sectionStack.empty() ) {
                if( !m_rootSection )
                    m_rootSection = new SectionNode( incompleteStats );
                node = m_rootSection;
            }
            else {
                SectionNode& parentNode = *m_sectionStack.back();
                SectionNode::ChildSections::const_iterator it =
                    std::find_if(   parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
                if( it == parentNode.childSections.end() ) {
                    node = new SectionNode( incompleteStats );
                    parentNode.childSections.push_back( node );
                }
                else
                    node = *it;
            }
            m_sectionStack.push_back( node );
            m_deepestSection = node;
        }